

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O2

char is_type(Translation_Data *translation_data,Scope *scope)

{
  KEYWORDS KVar1;
  token *id;
  int *piVar2;
  char cVar3;
  
  id = (token *)translation_data->tokens->first->data;
  KVar1 = id->type;
  cVar3 = '\x01';
  if ((KW_STATIC < KVar1) || ((0x510f749cU >> (KVar1 & KW_WHILE) & 1) == 0)) {
    if ((KVar1 == KW_ID) &&
       ((piVar2 = (int *)check_ordinary(scope,id), piVar2 != (int *)0x0 && (*piVar2 == 4)))) {
      return '\x01';
    }
    cVar3 = '\0';
  }
  return cVar3;
}

Assistant:

char is_type(struct Translation_Data *translation_data,struct Scope *scope)
{
	struct token *hold;
	struct Denoted *thing;

	hold=translation_data->tokens->first->data;

	switch(hold->type)
	{
		case KW_ID:
			thing=check_ordinary(scope,hold);
			if(thing!=NULL && thing->denotation==DT_Typedef) 
				return 1;
			else return 0;
		case KW_CONST:
		case KW_VOLATILE:
		case KW_INT:
		case KW_VOID:
		case KW_CHAR:
		case KW_DOUBLE:
		case KW_FLOAT:
		case KW_LONG:
		case KW_SHORT:
		case KW_EXTERN:
		case KW_STATIC:
		case KW_TYPEDEF:
		case KW_STRUCT:
		case KW_UNION:
		case KW_ENUM:
			return 1;
		default:
			return 0;

	}
}